

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O1

ares_status_t ares_uri_parse_query(ares_uri_t *uri,ares_buf_t *buf)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  ares_buf_t *buf_00;
  ares_status_t aVar4;
  ares_status_t aVar5;
  ares_bool_t aVar6;
  size_t sVar7;
  size_t *psVar8;
  long lVar9;
  ares_status_t aVar10;
  uchar b_1;
  uchar b;
  char *key;
  char *val;
  ares_buf_t *query;
  uchar local_52;
  uchar local_51;
  char *local_50;
  char *local_48;
  ares_buf_t *local_40;
  size_t local_38;
  
  local_40 = (ares_buf_t *)0x0;
  sVar7 = ares_buf_len(buf);
  aVar4 = ARES_SUCCESS;
  if (((sVar7 != 0) && (aVar4 = ares_buf_peek_byte(buf,&local_51), aVar4 == ARES_SUCCESS)) &&
     (aVar4 = ARES_SUCCESS, local_51 == '?')) {
    ares_buf_consume(buf,1);
    ares_buf_tag(buf);
    aVar4 = ARES_SUCCESS;
    sVar7 = ares_buf_consume_until_charset(buf,"#",1,ARES_FALSE);
    if ((sVar7 != 0) &&
       (aVar4 = ares_buf_tag_fetch_constbuf(buf,&local_40), buf_00 = local_40, aVar4 == ARES_SUCCESS
       )) {
      aVar4 = ARES_SUCCESS;
      local_50 = (char *)0x0;
      local_48 = (char *)0x0;
      sVar7 = ares_buf_len(local_40);
      while (sVar7 != 0) {
        local_52 = '\0';
        ares_buf_tag(buf_00);
        bVar2 = false;
        psVar8 = (size_t *)0x0;
        local_38 = ares_buf_consume_until_charset(buf_00,(uchar *)"&=",2,ARES_FALSE);
        aVar10 = ARES_EBADSTR;
        aVar4 = ARES_EBADSTR;
        if (local_38 == 0) goto LAB_00129874;
        sVar7 = ares_buf_len(buf_00);
        if (((sVar7 == 0) || (aVar5 = ares_buf_peek_byte(buf_00,&local_52), aVar5 == ARES_SUCCESS))
           && (aVar5 = ares_buf_tag_fetch_strdup(buf_00,&local_50), pcVar3 = local_50,
              aVar5 == ARES_SUCCESS)) {
          aVar4 = aVar10;
          if (local_50 == (char *)0x0) goto LAB_001299a4;
          lVar9 = 1;
          do {
            cVar1 = pcVar3[lVar9 + -1];
            if (cVar1 == '\0') break;
            aVar6 = ares_uri_chis_query(cVar1);
            if ((cVar1 != '%') && (aVar6 == ARES_FALSE)) goto LAB_001299af;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          aVar4 = ares_uri_decode_inplace(pcVar3,ARES_TRUE,(ares_bool_t)&local_38,psVar8);
          if (aVar4 == ARES_SUCCESS) {
            if (local_52 == '=') {
              ares_buf_consume(buf_00,1);
              ares_buf_tag(buf_00);
              psVar8 = (size_t *)0x0;
              local_38 = ares_buf_consume_until_charset(buf_00,(uchar *)"&",1,ARES_FALSE);
              if (local_38 != 0) {
                aVar5 = ares_buf_tag_fetch_strdup(buf_00,&local_48);
                pcVar3 = local_48;
                if (aVar5 != ARES_SUCCESS) goto LAB_0012986e;
                aVar4 = aVar10;
                if (local_48 != (char *)0x0) {
                  lVar9 = 1;
                  do {
                    cVar1 = pcVar3[lVar9 + -1];
                    if (cVar1 == '\0') break;
                    aVar6 = ares_uri_chis_query(cVar1);
                    if ((cVar1 != '%') && (aVar6 == ARES_FALSE)) goto LAB_001299af;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 0);
                  aVar4 = ares_uri_decode_inplace(pcVar3,ARES_TRUE,(ares_bool_t)&local_38,psVar8);
                  if (aVar4 == ARES_SUCCESS) goto LAB_001299c0;
                }
LAB_001299a4:
                bVar2 = false;
                goto LAB_00129874;
              }
            }
LAB_001299c0:
            if (local_52 != '\0') {
              ares_buf_consume(buf_00,1);
            }
            aVar5 = ares_uri_set_query_key(uri,local_50,local_48);
            aVar4 = ARES_SUCCESS;
            if (aVar5 != ARES_SUCCESS) goto LAB_0012986e;
            ares_free(local_50);
            local_50 = (char *)0x0;
            ares_free(local_48);
            local_48 = (char *)0x0;
            bVar2 = true;
          }
          else {
LAB_001299af:
            bVar2 = false;
          }
        }
        else {
LAB_0012986e:
          bVar2 = false;
          aVar4 = aVar5;
        }
LAB_00129874:
        if (!bVar2) break;
        sVar7 = ares_buf_len(buf_00);
      }
      ares_free(local_50);
      ares_free(local_48);
      ares_buf_destroy(local_40);
    }
  }
  return aVar4;
}

Assistant:

static ares_status_t ares_uri_parse_query(ares_uri_t *uri, ares_buf_t *buf)
{
  unsigned char b;
  ares_status_t status;
  ares_buf_t   *query = NULL;
  size_t        len;

  if (ares_buf_len(buf) == 0) {
    return ARES_SUCCESS;
  }

  status = ares_buf_peek_byte(buf, &b);
  if (status != ARES_SUCCESS) {
    return status;
  }

  /* Not a query, must be one of the others */
  if (b != '?') {
    return ARES_SUCCESS;
  }

  /* Only possible terminator is fragment indicator of '#' */
  ares_buf_consume(buf, 1);
  ares_buf_tag(buf);
  len = ares_buf_consume_until_charset(buf, (const unsigned char *)"#", 1,
                                       ARES_FALSE);
  if (len == 0) {
    /* No data, return */
    return ARES_SUCCESS;
  }

  status = ares_buf_tag_fetch_constbuf(buf, &query);
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_uri_parse_query_buf(uri, query);
  ares_buf_destroy(query);

  return status;
}